

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::dodamage(clientinfo *target,clientinfo *actor,int damage,int gun,vec *hitpush)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  int iVar7;
  vec *v_00;
  char *pcVar8;
  char *pcVar9;
  clientinfo **ppcVar10;
  spreemsg *psVar11;
  spreemsg *psVar12;
  bool bVar13;
  float fVar14;
  double dVar15;
  int local_d8;
  teaminfo *local_c8;
  int local_b4;
  char *local_b0;
  int local_90;
  int local_8c;
  int i_1;
  teaminfo *t;
  int i;
  int enemies;
  int friends;
  int fragvalue;
  int distanceinteger;
  float d;
  float z1;
  float z2;
  float y1;
  float y2;
  float x1;
  float x2;
  undefined4 local_48;
  undefined1 local_44 [8];
  ivec v;
  gamestate *ts;
  vec *hitpush_local;
  int gun_local;
  int damage_local;
  clientinfo *actor_local;
  clientinfo *target_local;
  
  (actor->state).guninfo[gun].damage = damage + (actor->state).guninfo[gun].damage;
  v.field_0._4_8_ = &target->state;
  if ((((enable_passflag == 0) || (actor == target)) || (gamemode < -3)) ||
     (((0x16 < gamemode || ((gamemodes[gamemode + 3].flags & 1U) == 0)) ||
      (iVar7 = strcmp(actor->team,target->team), iVar7 != 0)))) {
    if (nodamage == 0) {
      fpsstate::dodamage((fpsstate *)v.field_0._4_8_,damage);
      sendf(-1,1,"ri6",0xc,(ulong)(uint)target->clientnum,(ulong)(uint)actor->clientnum,damage,
            *(undefined4 *)(v.field_0._4_8_ + 8),*(undefined4 *)v.field_0._4_8_);
    }
    if ((target != actor) &&
       (((gamemode < -3 || (0x16 < gamemode)) ||
        (((gamemodes[gamemode + 3].flags & 1U) == 0 ||
         (iVar7 = strcmp(target->team,actor->team), iVar7 != 0)))))) {
      (actor->state).damage = damage + (actor->state).damage;
    }
    if (target == actor) {
      clientinfo::setpushed(target);
    }
    else {
      bVar13 = vec::iszero(hitpush);
      if (!bVar13) {
        _x1 = *(undefined8 *)&hitpush->field_0;
        local_48 = (hitpush->field_0).field_0.z;
        v_00 = vec::rescale((vec *)&x1,100.0);
        ivec::ivec((ivec *)local_44,v_00);
        if (*(int *)v.field_0._4_8_ < 1) {
          local_90 = -1;
        }
        else {
          local_90 = target->ownernum;
        }
        sendf(local_90,1,"ri7",0xd,(ulong)(uint)target->clientnum,(ulong)(uint)gun,damage,
              local_44._0_4_,local_44._4_4_,v.field_0.field_0.x);
        clientinfo::setpushed(target);
      }
    }
    if (*(int *)v.field_0._4_8_ < 1) {
      fVar14 = (target->state).o.field_0.field_0.x;
      fVar1 = (actor->state).o.field_0.field_0.x;
      fVar2 = (target->state).o.field_0.field_0.y;
      fVar3 = (actor->state).o.field_0.field_0.y;
      fVar4 = (target->state).o.field_0.field_0.z;
      fVar5 = (actor->state).o.field_0.field_0.z;
      dVar15 = std::sqrt((double)(ulong)(uint)((fVar4 - fVar5) * (fVar4 - fVar5) +
                                              (fVar14 - fVar1) * (fVar14 - fVar1) +
                                              (fVar2 - fVar3) * (fVar2 - fVar3)));
      fVar14 = SUB84(dVar15,0);
      if ((((700.0 < fVar14) && (0 < (int)(fVar14 + 0.5))) && (actor != target)) &&
         ((actor->state).super_fpsstate.aitype == 0)) {
        pcVar8 = colorname(actor);
        pcVar9 = colorname(target);
        out(3,"\f0%s \f7got a longshot kill on \f6%s \f7(Distance: %d\f7 feet) with a \f1%s",pcVar8,
            pcVar9,(ulong)(uint)(int)(fVar14 + 0.5),guns[gun].name);
      }
      if (((fVar14 <= 20.0) && (actor != target)) && ((actor->state).super_fpsstate.aitype == 0)) {
        pcVar8 = colorname(actor);
        pcVar9 = colorname(target);
        iVar7 = strcmp(guns[gun].name,"fist");
        if (iVar7 == 0) {
          local_b0 = "chainsaw";
        }
        else {
          local_b0 = guns[gun].name;
        }
        out(3,"\f0%s \f7got an up close kill on \f6%s \f7with a \f1%s",pcVar8,pcVar9,local_b0);
      }
      (target->state).deaths = (target->state).deaths + 1;
      if (smode == (long *)0x0) {
        bVar13 = true;
        if (((target != actor) && (bVar13 = false, -4 < gamemode)) &&
           ((bVar13 = false, gamemode < 0x17 &&
            (bVar13 = false, (gamemodes[gamemode + 3].flags & 1U) != 0)))) {
          iVar7 = strcmp(target->team,actor->team);
          bVar13 = iVar7 == 0;
        }
        local_b4 = 1;
        if (bVar13) {
          local_b4 = -1;
        }
      }
      else {
        local_b4 = (**(code **)(*smode + 0x38))(smode,target,actor);
      }
      (actor->state).frags = local_b4 + (actor->state).frags;
      if (0 < local_b4) {
        i = 0;
        t._4_4_ = 0;
        if (((gamemode < -3) || (0x16 < gamemode)) || ((gamemodes[gamemode + 3].flags & 1U) == 0)) {
          i = 1;
          iVar7 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients);
          t._4_4_ = iVar7 + -1;
        }
        else {
          for (t._0_4_ = 0;
              iVar7 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients),
              (int)t < iVar7; t._0_4_ = (int)t + 1) {
            ppcVar10 = vector<server::clientinfo_*>::operator[]
                                 ((vector<server::clientinfo_*> *)clients,(int)t);
            iVar7 = strcmp((*ppcVar10)->team,actor->team);
            if (iVar7 == 0) {
              i = i + 1;
            }
            else {
              t._4_4_ = t._4_4_ + 1;
            }
          }
        }
        iVar7 = max<int>(t._4_4_,1);
        (actor->state).effectiveness =
             (float)(local_b4 * i) / (float)iVar7 + (actor->state).effectiveness;
        if ((long)totalmillis - (actor->state).lastfragmillis < (long)multifragmillis) {
          (actor->state).multifrags = (actor->state).multifrags + 1;
        }
        else {
          (actor->state).multifrags = 1;
        }
        (actor->state).lastfragmillis = (long)totalmillis;
      }
      if (((gamemode < -3) || (0x16 < gamemode)) || ((gamemodes[gamemode + 3].flags & 1U) == 0)) {
        local_c8 = (teaminfo *)0x0;
      }
      else {
        local_c8 = hashset<teaminfo>::access<char[260]>
                             ((hashset<teaminfo> *)&teaminfos,&actor->team);
      }
      if (local_c8 != (teaminfo *)0x0) {
        local_c8->frags = local_b4 + local_c8->frags;
      }
      if (local_c8 == (teaminfo *)0x0) {
        local_d8 = 0;
      }
      else {
        local_d8 = local_c8->frags;
      }
      sendf(-1,1,"ri5",0xb,(ulong)(uint)target->clientnum,(ulong)(uint)actor->clientnum,
            (actor->state).frags,local_d8);
      if (((firstblood & 1) == 0) && (actor != target)) {
        firstblood = 1;
        pcVar8 = colorname(actor);
        out(3,"\f0%s \f7drew \f6FIRST BLOOD!",pcVar8);
      }
      if ((actor != target) && ((actor->state).super_fpsstate.aitype == 0)) {
        (actor->state).spreefrags = (actor->state).spreefrags + 1;
      }
      if ((minspreefrags <= (target->state).spreefrags) &&
         ((target->state).super_fpsstate.aitype == 0)) {
        if (actor == target) {
          pcVar8 = colorname(target);
          out(3,"\f0%s \f7%s",pcVar8,spreesuicidemsg);
        }
        else {
          pcVar8 = colorname(target);
          uVar6 = spreefinmsg;
          pcVar9 = colorname(actor);
          out(3,"\f0%s\'s \f7%s \f6%s",pcVar8,uVar6,pcVar9);
        }
      }
      (target->state).spreefrags = 0;
      (target->state).multifrags = 0;
      (target->state).lastfragmillis = 0;
      for (local_8c = 0;
          iVar7 = vector<server::spreemsg>::length((vector<server::spreemsg> *)spreemessages),
          local_8c < iVar7; local_8c = local_8c + 1) {
        iVar7 = (actor->state).spreefrags;
        psVar11 = vector<server::spreemsg>::operator[]
                            ((vector<server::spreemsg> *)spreemessages,local_8c);
        if (iVar7 == psVar11->frags) {
          pcVar8 = colorname(actor);
          psVar11 = vector<server::spreemsg>::operator[]
                              ((vector<server::spreemsg> *)spreemessages,local_8c);
          psVar12 = vector<server::spreemsg>::operator[]
                              ((vector<server::spreemsg> *)spreemessages,local_8c);
          out(3,"\f0%s \f7%s \f6%s",pcVar8,psVar11->msg1,psVar12->msg2);
        }
      }
      vector<unsigned_char>::setsize(&target->position,0);
      if (smode != (long *)0x0) {
        (**(code **)(*smode + 0x40))(smode,target,actor);
      }
      *(undefined4 *)(v.field_0._4_8_ + 0x74) = 1;
      *(undefined4 *)(v.field_0._4_8_ + 0x7c) = gamemillis;
      if ((((actor != target) && (-4 < gamemode)) && (gamemode < 0x17)) &&
         (((gamemodes[gamemode + 3].flags & 1U) != 0 &&
          (iVar7 = strcmp(actor->team,target->team), iVar7 == 0)))) {
        (actor->state).teamkills = (actor->state).teamkills + 1;
        addteamkill(actor,target,1);
      }
      *(int *)(v.field_0._4_8_ + 0x80) = *(int *)(v.field_0._4_8_ + 0x7c) + 300;
    }
  }
  else {
    ctfservmode::dopassflagsequence((ctfservmode *)ctfmode,actor,target);
  }
  return;
}

Assistant:

void dodamage(clientinfo *target, clientinfo *actor, int damage, int gun, const vec &hitpush = vec(0, 0, 0))
    {
        actor->state.guninfo[gun].damage += damage; //damage by gun for #stats
        gamestate &ts = target->state;
        if(enable_passflag && actor!=target && isteam(actor->team, target->team)) {
            ctfmode.dopassflagsequence(actor,target);
            return;
        }
        if(!nodamage) {
            ts.dodamage(damage);
            sendf(-1, 1, "ri6", N_DAMAGE, target->clientnum, actor->clientnum, damage, ts.armour, ts.health);
        }
        if(target!=actor && !isteam(target->team, actor->team)) actor->state.damage += damage;
        if(target==actor) target->setpushed();
        else if(!hitpush.iszero())
        {
            ivec v(vec(hitpush).rescale(DNF));
            sendf(ts.health<=0 ? -1 : target->ownernum, 1, "ri7", N_HITPUSH, target->clientnum, gun, damage, v.x, v.y, v.z);
            target->setpushed();
        }
        if(ts.health<=0)
        {
            //QServ longshot and close up kill (y - depth, z - height, x - left/right)
            float x2 = target->state.o.x;     //target shot x
            float x1 = actor->state.o.x;      //actor shot x
            float y2 = target->state.o.y;     //target shot y
            float y1 = actor->state.o.y;      //actor shot y
            float z2 = target->state.o.z;     //target shot z
            float z1 = actor->state.o.z;      //actor shot z
            
            float d = sqrt(((x2-x1)*(x2-x1))+((y2-y1)*(y2-y1))+((z2-z1)*(z2-z1)));
            int distanceinteger = int(d + 0.5);
            
            //no teamkills, or weird negative float
            if(d > 700.0 && distanceinteger > 0 && actor != target && actor->state.aitype == AI_NONE) {
                out(ECHO_SERV,"\f0%s \f7got a longshot kill on \f6%s \f7(Distance: %d\f7 feet) with a \f1%s", colorname(actor), colorname(target), distanceinteger, guns[gun].name);
            }
            if(d <= 20.0 && actor != target && actor->state.aitype == AI_NONE) {
                out(ECHO_SERV,"\f0%s \f7got an up close kill on \f6%s \f7with a \f1%s", colorname(actor), colorname(target), (!strcmp(guns[gun].name, "fist" )) ? "chainsaw" : guns[gun].name);
            }
            
            target->state.deaths++;
            int fragvalue = smode ? smode->fragvalue(target, actor) : (target==actor || isteam(target->team, actor->team) ? -1 : 1);
            actor->state.frags += fragvalue;
            
            if(fragvalue>0)
            {
                int friends = 0, enemies = 0; // note: friends also includes the fragger
                if(m_teammode) loopv(clients) if(strcmp(clients[i]->team, actor->team)) enemies++; else friends++;
                else { friends = 1; enemies = clients.length()-1; }
                actor->state.effectiveness += fragvalue*friends/float(max(enemies, 1));
                if(totalmillis - actor->state.lastfragmillis < (int64_t)multifragmillis) {
                    actor->state.multifrags++;
                } else {
                    actor->state.multifrags = 1;
                }
                actor->state.lastfragmillis = totalmillis;
            }
            teaminfo *t = m_teammode ? teaminfos.access(actor->team) : NULL;
            if(t) t->frags += fragvalue;
            sendf(-1, 1, "ri5", N_DIED, target->clientnum, actor->clientnum, actor->state.frags, t ? t->frags : 0);
            if(!firstblood && actor != target) { firstblood = true; out(ECHO_SERV, "\f0%s \f7drew \f6FIRST BLOOD!", colorname(actor)); }
            if(actor != target && actor->state.aitype == AI_NONE) actor->state.spreefrags++;
            if(target->state.spreefrags >= minspreefrags && target->state.aitype == AI_NONE) {
                if(actor == target)
                    out(ECHO_SERV, "\f0%s \f7%s", colorname(target), spreesuicidemsg);
                else
                    out(ECHO_SERV, "\f0%s's \f7%s \f6%s", colorname(target), spreefinmsg, colorname(actor));
            }
            target->state.spreefrags = 0;
            target->state.multifrags = 0;
            target->state.lastfragmillis = 0;
            loopv(spreemessages) {
                if(actor->state.spreefrags == spreemessages[i].frags) out(ECHO_SERV, "\f0%s \f7%s \f6%s", colorname(actor), spreemessages[i].msg1, spreemessages[i].msg2);
            }
            target->position.setsize(0);
            if(smode) smode->died(target, actor);
            ts.state = CS_DEAD;
            ts.lastdeath = gamemillis;
            if(actor!=target && isteam(actor->team, target->team))
            {
                actor->state.teamkills++;
                addteamkill(actor, target, 1);
            }
            ts.deadflush = ts.lastdeath + DEATHMILLIS;
            // ts.respawn(); don't issue respawn yet until DEATHMILLIS has elapsed
        }
    }